

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

char * CVmObjFileName::get_local_path(vm_val_t *val)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  
  if (val->typ == VM_OBJ) {
    uVar1 = (val->val).obj & 0xfff;
    iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc][uVar1].ptr_ + 8))
                      (G_obj_table_X.pages_[(val->val).obj >> 0xc] + uVar1,metaclass_reg_);
    if (iVar2 != 0) {
      if (G_obj_table_X.pages_[(val->val).obj >> 0xc] != (CVmObjPageEntry *)0x0) {
        return (char *)(*(long *)((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                         [(val->val).obj & 0xfff].ptr_ + 8) + 6);
      }
    }
  }
  pcVar3 = vm_val_t::get_as_string(val);
  return pcVar3;
}

Assistant:

const char *CVmObjFileName::get_local_path(VMG_ const vm_val_t *val)
{
    CVmObjFileName *fn;
    const char *str;
    if ((fn = vm_val_cast(CVmObjFileName, val)) != 0)
    {
        /* it's a FileName object - return a copy of its filename string */
        return fn->get_ext()->str;
    }
    else if ((str = val->get_as_string(vmg0_)) != 0)
    {
        /* it's a string, so convert from URL notation to local path syntax */
        return str;
    }
    else
    {
        /* it's not a string or FileName */
        return 0;
    }
}